

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

int __thiscall Js::DebuggerScope::GetScopeDepth(DebuggerScope *this)

{
  int depth;
  int iVar1;
  
  iVar1 = 0;
  for (; this != (DebuggerScope *)0x0; this = (this->parentScope).ptr) {
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int DebuggerScope::GetScopeDepth() const
    {
        int depth = 0;
        const DebuggerScope* currentDebuggerScope = this;
        while (currentDebuggerScope)
        {
            currentDebuggerScope = currentDebuggerScope->GetParentScope();
            ++depth;
        }

        return depth;
    }